

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

padding_info __thiscall
spdlog::pattern_formatter::handle_padspec_
          (pattern_formatter *this,const_iterator *it,const_iterator end)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  byte *pbVar5;
  unsigned_long *puVar6;
  padding_info pVar7;
  size_t digit;
  size_t width;
  unsigned_long uStack_38;
  pad_side side;
  size_t max_width;
  const_iterator *it_local;
  pattern_formatter *this_local;
  const_iterator end_local;
  undefined4 local_10;
  
  uStack_38 = 0x80;
  max_width = (size_t)it;
  it_local = (const_iterator *)this;
  this_local = (pattern_formatter *)end._M_current;
  bVar1 = __gnu_cxx::operator==
                    (it,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&this_local);
  if (bVar1) {
    memset(&end_local,0,0x10);
    details::padding_info::padding_info((padding_info *)&end_local);
  }
  else {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)max_width);
    if (*pcVar4 == '-') {
      width._4_4_ = right;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)max_width);
    }
    else if (*pcVar4 == '=') {
      width._4_4_ = center;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)max_width);
    }
    else {
      width._4_4_ = left;
    }
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)max_width,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&this_local);
    if (!bVar1) {
      pbVar5 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)max_width);
      iVar3 = isdigit((uint)*pbVar5);
      if (iVar3 != 0) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)max_width);
        digit = (size_t)(*pcVar4 + -0x30);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)max_width);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)max_width,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&this_local);
          bVar1 = false;
          if (bVar2) {
            pbVar5 = (byte *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)max_width);
            iVar3 = isdigit((uint)*pbVar5);
            bVar1 = iVar3 != 0;
          }
          if (!bVar1) break;
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)max_width);
          digit = digit * 10 + (long)(*pcVar4 + -0x30);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)max_width);
        }
        puVar6 = std::min<unsigned_long>(&digit,&stack0xffffffffffffffc8);
        details::padding_info::padding_info((padding_info *)&end_local,*puVar6,width._4_4_);
        goto LAB_0031afc9;
      }
    }
    details::padding_info::padding_info((padding_info *)&end_local,0,width._4_4_);
  }
LAB_0031afc9:
  pVar7._12_4_ = 0;
  pVar7.width_ = (size_t)end_local._M_current;
  pVar7.side_ = local_10;
  return pVar7;
}

Assistant:

details::padding_info handle_padspec_(std::string::const_iterator &it, std::string::const_iterator end)
    {
        using details::padding_info;
        using details::scoped_pad;
        const size_t max_width = 128;
        if (it == end)
        {
            return padding_info{};
        }

        padding_info::pad_side side;
        switch (*it)
        {
        case '-':
            side = padding_info::right;
            ++it;
            break;
        case '=':
            side = padding_info::center;
            ++it;
            break;
        default:
            side = details::padding_info::left;
            break;
        }

        if (it == end || !std::isdigit(static_cast<unsigned char>(*it)))
        {
            return padding_info{0, side};
        }

        auto width = static_cast<size_t>(*it - '0');
        for (++it; it != end && std::isdigit(static_cast<unsigned char>(*it)); ++it)
        {
            auto digit = static_cast<size_t>(*it - '0');
            width = width * 10 + digit;
        }
        return details::padding_info{std::min<size_t>(width, max_width), side};
    }